

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersections.c
# Opt level: O1

_Bool intersects_box(Vec3 vmin,Vec3 vmax,Ray r)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 local_18;
  float local_10;
  undefined8 local_c;
  float local_4;
  
  local_18 = vmin._0_8_;
  local_10 = vmin.z;
  local_c = vmax._0_8_;
  local_4 = vmax.z;
  fVar4 = (*(float *)((long)&local_18 + (ulong)(r.d.x < 0.0) * 0xc) - r.o.x) * (1.0 / r.d.x);
  fVar3 = (*(float *)((long)&local_18 + (ulong)(0.0 <= r.d.y) * 0xc + 4) - r.o.y) * (1.0 / r.d.y);
  if (fVar4 <= fVar3) {
    fVar1 = (1.0 / r.d.x) * (*(float *)((long)&local_18 + (ulong)(0.0 <= r.d.x) * 0xc) - r.o.x);
    fVar2 = (1.0 / r.d.y) * (*(float *)((long)&local_18 + (ulong)(r.d.y < 0.0) * 0xc + 4) - r.o.y);
    if (fVar2 <= fVar1) {
      if (fVar2 <= fVar4) {
        fVar2 = fVar4;
      }
      if (fVar2 <= ((&local_10)[(ulong)(0.0 <= r.d.z) * 3] - r.o.z) * (1.0 / r.d.z)) {
        if (fVar1 <= fVar3) {
          fVar3 = fVar1;
        }
        if ((1.0 / r.d.z) * ((&local_10)[(ulong)(r.d.z < 0.0) * 3] - r.o.z) <= fVar3) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool intersects_box(Vec3 vmin, Vec3 vmax, Ray r) {
    Vec3 bounds[2] = {vmin, vmax};
    float tmin, tmax, tymin, tymax, tzmin, tzmax;
    bool sign[3];
    sign[0] = r.d.x < 0.0f;
    sign[1] = r.d.y < 0.0f;
    sign[2] = r.d.z < 0.0f;
    Vec3 invdir = {
        1.0f / r.d.x,
        1.0f / r.d.y,
        1.0f / r.d.z
    };
 
    tmin = (bounds[sign[0]].x - r.o.x) * invdir.x; 
    tmax = (bounds[!sign[0]].x - r.o.x) * invdir.x; 
    tymin = (bounds[sign[1]].y - r.o.y) * invdir.y; 
    tymax = (bounds[!sign[1]].y - r.o.y) * invdir.y; 
 
    if ((tmin > tymax) || (tymin > tmax)) 
        return false; 
    if (tymin > tmin) 
        tmin = tymin; 
    if (tymax < tmax) 
        tmax = tymax; 
 
    tzmin = (bounds[sign[2]].z - r.o.z) * invdir.z; 
    tzmax = (bounds[!sign[2]].z - r.o.z) * invdir.z; 
 
    if ((tmin > tzmax) || (tzmin > tmax)) 
        return false; 
 
    return true; 
}